

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O0

int __thiscall btBU_Simplex1to4::getNumPlanes(btBU_Simplex1to4 *this)

{
  btBU_Simplex1to4 *this_local;
  int local_4;
  
  switch(*(undefined4 *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74) {
  case 0:
    local_4 = 0;
    break;
  case 1:
    local_4 = 0;
    break;
  case 2:
    local_4 = 0;
    break;
  case 3:
    local_4 = 2;
    break;
  case 4:
    local_4 = 4;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int	btBU_Simplex1to4::getNumPlanes() const
{
	switch (m_numVertices)
	{
	case 0:
			return 0;
	case 1:
			return 0;
	case 2:
			return 0;
	case 3:
			return 2;
	case 4:
			return 4;
	default:
		{
		}
	}
	return 0;
}